

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imleDemoNoTemplates.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  ostream *poVar1;
  
  demo1();
  demo2();
  demo3();
  poVar1 = std::operator<<((ostream *)&std::cout,"\n\t --- IMLE demo (no templates) ended! ---");
  std::endl<char,std::char_traits<char>>(poVar1);
  return 0;
}

Assistant:

int main(int argc, char **argv)
{
    demo1();
    demo2();
    demo3();

    cout << "\n\t --- IMLE demo (no templates) ended! ---" << endl;
    return 0;
}